

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QFontDatabase::WritingSystem,_QString> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_>::
findNode<QFontDatabase::WritingSystem>
          (Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_> *this,WritingSystem *key
          )

{
  byte bVar1;
  Node<QFontDatabase::WritingSystem,_QString> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QFontDatabase::WritingSystem>(this,key);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QFontDatabase::WritingSystem,_QString> *)0x0;
  }
  else {
    pNVar2 = (Node<QFontDatabase::WritingSystem,_QString> *)((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }